

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

Value * __thiscall
optimization::common_expr_del::BlockNodes::convert_operand_to_value
          (BlockNodes *this,Operand *operand)

{
  char *pcVar1;
  NodeId *pNVar2;
  int in_EDX;
  undefined4 in_register_00000014;
  char *in_RSI;
  Value *in_RDI;
  NodeId nodeId;
  int imm;
  undefined4 in_stack_ffffffffffffffb8;
  int32_t in_stack_ffffffffffffffbc;
  Value *this_00;
  
  this_00 = (Value *)CONCAT44(in_register_00000014,in_EDX);
  pcVar1 = std::
           variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::index((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this_00,in_RSI,in_EDX);
  if (pcVar1 == (char *)0x0) {
    std::get<int,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
              ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x17a01c);
    mir::inst::Value::Value(this_00,in_stack_ffffffffffffffbc);
  }
  else {
    pNVar2 = std::
             get<optimization::common_expr_del::NodeId,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                       ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x17a03c);
    std::
    vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
    ::operator[]((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                  *)(in_RSI + 8),(ulong)pNVar2->id);
    std::
    __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x17a05e);
    mir::inst::Value::Value
              (this_00,(Value *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  return in_RDI;
}

Assistant:

mir::inst::Value convert_operand_to_value(Operand operand) {
    if (operand.index() == 0) {
      auto imm = std::get<int>(operand);
      return imm;
    } else {
      auto nodeId = std::get<NodeId>(operand);
      return nodes[nodeId.id]->mainVar;
    }
  }